

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::~ThreadContext(ThreadContext *this)

{
  IdleDecommitPageAllocator *this_00;
  RecyclerRootPtr<ThreadContext::RecyclableData> *this_01;
  DListBase<Js::EntryPointInfo_*,_RealCount> *this_02;
  ScriptContext *pSVar1;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  BackgroundJobProcessor *obj;
  code *pcVar3;
  bool bVar4;
  RecyclableData *pRVar5;
  undefined4 *puVar6;
  ulong uVar7;
  char16_t *pcVar8;
  ScriptContext **ppSVar9;
  ScriptContext **ppSVar10;
  AutoCriticalSection local_40;
  AutoCriticalSection autocs;
  
  local_40.cs = &s_csThreadContext;
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::Unlink<ThreadContext>
            (this,&globalListFirst,&globalListLast);
  AutoCriticalSection::~AutoCriticalSection(&local_40);
  if (this->TTDContext != (ThreadContextTTD *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ThreadContextTTD>
              (&Memory::HeapAllocator::Instance,this->TTDContext);
    this->TTDContext = (ThreadContextTTD *)0x0;
  }
  if (this->TTDExecutionInfo != (ExecutionInfoManager *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ExecutionInfoManager>
              (&Memory::HeapAllocator::Instance,this->TTDExecutionInfo);
    this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  }
  if (this->TTDLog != (EventLog *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::EventLog>
              (&Memory::HeapAllocator::Instance,this->TTDLog);
    this->TTDLog = (EventLog *)0x0;
  }
  bVar4 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
  if (bVar4) {
    if (this->recycler->inDllCanUnloadNow == false) {
      pcVar8 = L"Destructor";
      if (this->recycler->inDetachProcess != false) {
        pcVar8 = L"DetachProcess";
      }
    }
    else {
      pcVar8 = L"DllCanUnloadNow";
    }
    Memory::AutoLeakReportSection::AutoLeakReportSection
              ((AutoLeakReportSection *)&local_40,(ConfigFlagsTable *)&Js::Configuration::Global,
               L"Thread Context (%p): %s (TID: %d)",this,pcVar8,(ulong)this->threadId);
    Memory::LeakReport::DumpUrl(this->threadId);
    Memory::AutoLeakReportSection::~AutoLeakReportSection((AutoLeakReportSection *)&local_40);
  }
  if (this->interruptPoller != (InterruptPoller *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterruptPoller>
              (&Memory::HeapAllocator::Instance,this->interruptPoller);
    this->interruptPoller = (InterruptPoller *)0x0;
  }
  this_00 = &this->pageAllocator;
  Memory::IdleDecommitPageAllocator::ShutdownIdleDecommit(this_00);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Close(&this_00->super_PageAllocator);
  if (this->recycler != (Recycler *)0x0) {
    autocs.cs = (CriticalSection *)__tls_get_addr(&PTR_013e5f18);
    ppSVar10 = &this->scriptContextList;
    ppSVar9 = ppSVar10;
    while (pSVar1 = *ppSVar9, pSVar1 != (ScriptContext *)0x0) {
      if (pSVar1->isScriptContextActuallyClosed == false) {
        if (this->callRootLevel != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ((autocs.cs)->super_CCLock).mutexPtr[0] = '\x01';
          ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
          ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
          ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0x1bf,"(!IsInScript())","Can we be in script here?");
          if (!bVar4) goto LAB_0070e2b6;
          ((autocs.cs)->super_CCLock).mutexPtr[0] = '\0';
          ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
          ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
          ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
        }
        Js::ScriptContext::MarkForClose(pSVar1);
      }
      ppSVar9 = &pSVar1->next;
    }
    this_01 = &this->recyclableData;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->sourceProfileManagersByUrl).ptr !=
        (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      pBVar2 = (pRVar5->sourceProfileManagersByUrl).ptr;
      if (pBVar2->count != pBVar2->freeCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        ((autocs.cs)->super_CCLock).mutexPtr[0] = '\x01';
        ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
        ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
        ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x1c7,
                           "(this->recyclableData->sourceProfileManagersByUrl == nullptr || this->recyclableData->sourceProfileManagersByUrl->Count() == 0)"
                           ,"There seems to have been a refcounting imbalance.");
        if (!bVar4) goto LAB_0070e2b6;
        ((autocs.cs)->super_CCLock).mutexPtr[0] = '\0';
        ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
        ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
        ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
      }
    }
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    (pRVar5->sourceProfileManagersByUrl).ptr =
         (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    (pRVar5->oldEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->symbolRegistrationMap).ptr !=
        (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      JsUtil::
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear((pRVar5->symbolRegistrationMap).ptr);
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (pRVar5->symbolRegistrationMap).ptr =
           (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)0x0;
    }
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->returnedValueList).ptr !=
        (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
        )0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (((pRVar5->returnedValueList).ptr)->
      super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0;
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (pRVar5->returnedValueList).ptr =
           (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    }
    if (this->propertyMap !=
        (BaseHashSet<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
         *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>>
                (&Memory::HeapAllocator::Instance,this->propertyMap);
      this->propertyMap = (PropertyMap *)0x0;
    }
    if (this->m_jitNumericProperties != (BVSparse<Memory::HeapAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::HeapAllocator>>
                (&Memory::HeapAllocator::Instance,this->m_jitNumericProperties);
      this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
    }
    Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::Unroot(this_01,this->recycler);
    while (pSVar1 = *ppSVar10, pSVar1 != (ScriptContext *)0x0) {
      pSVar1->referencesSharedDynamicSourceContextInfo = false;
      Js::ScriptContext::ShutdownClearSourceLists(pSVar1);
      ppSVar10 = &pSVar1->next;
    }
    if (this->rootTrackerScriptContext != (ScriptContext *)0x0) {
      Js::ScriptContext::Close(this->rootTrackerScriptContext,false);
    }
    if (this->debugManager != (DebugManager *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      ((autocs.cs)->super_CCLock).mutexPtr[0] = '\x01';
      ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x209,"(this->debugManager == nullptr)","this->debugManager == nullptr");
      if (!bVar4) goto LAB_0070e2b6;
      ((autocs.cs)->super_CCLock).mutexPtr[0] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
    }
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::Recycler>
              (&Memory::HeapAllocator::Instance,this->recycler);
  }
  obj = (BackgroundJobProcessor *)this->jobProcessor;
  if (obj != (BackgroundJobProcessor *)0x0) {
    if (this->bgJit == true) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BackgroundJobProcessor>
                (&Memory::HeapAllocator::Instance,obj);
    }
    else {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::ForegroundJobProcessor>
                (&Memory::HeapAllocator::Instance,(ForegroundJobProcessor *)obj);
    }
    this->jobProcessor = (JobProcessor *)0x0;
  }
  autocs.cs = (CriticalSection *)&this->collectCallBackList;
  DListBase<ThreadContext::CollectCallBack,_RealCount>::Clear<Memory::HeapAllocator>
            ((DListBase<ThreadContext::CollectCallBack,_RealCount> *)autocs.cs,
             &Memory::HeapAllocator::Instance);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->protoInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->isInstInlineCacheByFunction);
  this_02 = &this->equivalentTypeCacheEntryPoints;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.next.list =
       this_02;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.prev.list =
       this_02;
  (this->equivalentTypeCacheEntryPoints).super_RealCount.count = 0;
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Reset
            (&this->noSpecialPropertyRegistry);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Reset
            (&this->onlyWritablePropertyRegistry);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  if (this->heapEnum != (IActiveScriptProfilerHeapEnum *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x231,"(this->GetHeapEnum() == nullptr)",
                       "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (!bVar4) goto LAB_0070e2b6;
    *puVar6 = 0;
    if (this->heapEnum != (IActiveScriptProfilerHeapEnum *)0x0) {
      ClearHeapEnum(this);
    }
  }
  bVar4 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag);
  if ((bVar4) && (DAT_01430398 == DAT_014303a0)) {
    Output::Print(L"Bail out byte code location count: %d",(ulong)this->bailOutByteCodeLocationCount
                 );
  }
  uVar7 = this->nativeCodeSize;
  if (processNativeCodeSize < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x23f,"(processNativeCodeSize >= nativeCodeSize)",
                       "processNativeCodeSize >= nativeCodeSize");
    if (!bVar4) {
LAB_0070e2b6:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    uVar7 = this->nativeCodeSize;
  }
  LOCK();
  processNativeCodeSize = processNativeCodeSize - uVar7;
  UNLOCK();
  if (this->dynamicProfileMutator != (DynamicProfileMutator *)0x0) {
    (**(code **)(*(long *)this->dynamicProfileMutator + 8))();
  }
  JsUtil::
  BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->entryPointToBuiltInOperationIdCache);
  DelayLoadLibrary::~DelayLoadLibrary(&(this->ucrtC99MathApis).super_DelayLoadLibrary);
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->dynamicObjectEnumeratorCacheMap);
  CCLock::~CCLock(&(this->csFunctionBody).super_CCLock);
  CCLock::~CCLock(&(this->csCollectionCallBack).super_CCLock);
  DListBase<ThreadContext::CollectCallBack,_RealCount>::~DListBase
            ((DListBase<ThreadContext::CollectCallBack,_RealCount> *)autocs.cs);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
  ~ThreadCacheRegistry(&this->onlyWritablePropertyRegistry);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
  ~ThreadCacheRegistry(&this->noSpecialPropertyRegistry);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->isInstInlineCacheByFunction);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->protoInlineCacheByPropId);
  DListBase<Js::EntryPointInfo_*,_RealCount>::~DListBase(this_02);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->equivalentTypeCacheInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->isInstInlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->inlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::~RecyclerRootPtr(&this->recyclableData);
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  ~CodePageAllocators(&this->codePageAllocators);
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  ~CodePageAllocators(&this->thunkPageAllocators);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->threadAlloc).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Js::DelayedFreeArrayBuffer::~DelayedFreeArrayBuffer(&this->delayFreeCallback);
  Memory::IdleDecommitPageAllocator::~IdleDecommitPageAllocator(this_00);
  CCLock::~CCLock(&(this->backgroundPageQueue).backgroundPageQueueCriticalSection.super_CCLock);
  Memory::PreReservedVirtualAllocWrapper::~PreReservedVirtualAllocWrapper
            (&this->preReservedVirtualAllocator);
  return;
}

Assistant:

ThreadContext::~ThreadContext()
{
    {
        AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
        ThreadContext::Unlink(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
    }

#if ENABLE_TTD
    if(this->TTDContext != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDContext);
        this->TTDContext = nullptr;
    }

    if(this->TTDExecutionInfo != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDExecutionInfo);
        this->TTDExecutionInfo = nullptr;
    }

    if(this->TTDLog != nullptr)
    {
        TT_HEAP_DELETE(TTD::EventLog, this->TTDLog);
        this->TTDLog = nullptr;
    }
#endif

#ifdef LEAK_REPORT
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        AUTO_LEAK_REPORT_SECTION(Js::Configuration::Global.flags, _u("Thread Context (%p): %s (TID: %d)"), this,
            this->GetRecycler()->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") :
            this->GetRecycler()->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"), this->threadId);
        LeakReport::DumpUrl(this->threadId);
    }
#endif
    if (interruptPoller)
    {
        HeapDelete(interruptPoller);
        interruptPoller = nullptr;
    }

#if DBG
    // ThreadContext dtor may be running on a different thread.
    // Recycler may call finalizer that free temp Arenas, which will free pages back to
    // the page Allocator, which will try to suspend idle on a different thread.
    // So we need to disable idle decommit asserts.
    pageAllocator.ShutdownIdleDecommit();
#endif

    // Allocating memory during the shutdown codepath is not preferred
    // so we'll close the page allocator before we release the GC
    // If any dispose is allocating memory during shutdown, that is a bug
    pageAllocator.Close();

    // The recycler need to delete before the background code gen thread
    // because that might run finalizer which need access to the background code gen thread.
    if (recycler != nullptr)
    {
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            if (!scriptContext->IsActuallyClosed())
            {
                // We close ScriptContext here because anyhow HeapDelete(recycler) when disposing the
                // JavaScriptLibrary will close ScriptContext. Explicit close gives us chance to clear
                // other things to which ScriptContext holds reference to
                AssertMsg(!IsInScript(), "Can we be in script here?");
                scriptContext->MarkForClose();
            }
        }

        // If all scriptContext's have been closed, then the sourceProfileManagersByUrl
        // should have been released
        AssertMsg(this->recyclableData->sourceProfileManagersByUrl == nullptr ||
            this->recyclableData->sourceProfileManagersByUrl->Count() == 0, "There seems to have been a refcounting imbalance.");

        this->recyclableData->sourceProfileManagersByUrl = nullptr;
        this->recyclableData->oldEntryPointInfo = nullptr;

        if (this->recyclableData->symbolRegistrationMap != nullptr)
        {
            this->recyclableData->symbolRegistrationMap->Clear();
            this->recyclableData->symbolRegistrationMap = nullptr;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->recyclableData->returnedValueList != nullptr)
        {
            this->recyclableData->returnedValueList->Clear();
            this->recyclableData->returnedValueList = nullptr;
        }
#endif

        if (this->propertyMap != nullptr)
        {
            HeapDelete(this->propertyMap);
            this->propertyMap = nullptr;
        }

#if ENABLE_NATIVE_CODEGEN
        if (this->m_jitNumericProperties != nullptr)
        {
            HeapDelete(this->m_jitNumericProperties);
            this->m_jitNumericProperties = nullptr;
        }
#endif
        // Unpin the memory for leak report so we don't report this as a leak.
        recyclableData.Unroot(recycler);

#if defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            scriptContext->ClearSourceContextInfoMaps();
            scriptContext->ShutdownClearSourceLists();
        }

#ifdef LEAK_REPORT
        // heuristically figure out which one is the root tracker script engine
        // and force close on it
        if (this->rootTrackerScriptContext != nullptr)
        {
            this->rootTrackerScriptContext->Close(false);
        }
#endif
#endif
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
        if (this->codeGenNumberThreadAllocator)
        {
            HeapDelete(this->codeGenNumberThreadAllocator);
            this->codeGenNumberThreadAllocator = nullptr;
        }
        if (this->xProcNumberPageSegmentManager)
        {
            HeapDelete(this->xProcNumberPageSegmentManager);
            this->xProcNumberPageSegmentManager = nullptr;
        }
#endif
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        Assert(this->debugManager == nullptr);
#endif

#if ENABLE_CONCURRENT_GC && defined(_WIN32)
        AssertOrFailFastMsg(recycler->concurrentThread == NULL, "Recycler background thread should have been shutdown before destroying Recycler.");
        AssertOrFailFastMsg((recycler->parallelThread1.concurrentThread == NULL) && (recycler->parallelThread2.concurrentThread == NULL), "Recycler parallelThread(s) should have been shutdown before destroying Recycler.");
#endif

        HeapDelete(recycler);
    }

#if ENABLE_NATIVE_CODEGEN
    if(jobProcessor)
    {
        if(this->bgJit)
        {
            HeapDelete(static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor));
        }
        else
        {
            HeapDelete(static_cast<JsUtil::ForegroundJobProcessor *>(jobProcessor));
        }
        jobProcessor = nullptr;
    }
#endif

    // Do not require all GC callbacks to be revoked, because Trident may not revoke if there
    // is a leak, and we don't want the leak to be masked by an assert

    this->collectCallBackList.Clear(&HeapAllocator::Instance);
    this->protoInlineCacheByPropId.Reset();
    this->storeFieldInlineCacheByPropId.Reset();
    this->isInstInlineCacheByFunction.Reset();
    this->equivalentTypeCacheEntryPoints.Reset();
    this->noSpecialPropertyRegistry.Reset();
    this->onlyWritablePropertyRegistry.Reset();

    this->registeredInlineCacheCount = 0;
    this->unregisteredInlineCacheCount = 0;

    AssertMsg(this->GetHeapEnum() == nullptr, "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (this->GetHeapEnum() != nullptr)
    {
        this->ClearHeapEnum();
    }

#ifdef BAILOUT_INJECTION
    if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
        && Js::Configuration::Global.flags.BailOutByteCode.Empty())
    {
        Output::Print(_u("Bail out byte code location count: %d"), this->bailOutByteCodeLocationCount);
    }
#endif

    Assert(processNativeCodeSize >= nativeCodeSize);
    ::InterlockedExchangeSubtract(&processNativeCodeSize, nativeCodeSize);

    PERF_COUNTER_DEC(Basic, ThreadContext);

#ifdef DYNAMIC_PROFILE_MUTATOR
    if (this->dynamicProfileMutator != nullptr)
    {
        this->dynamicProfileMutator->Delete();
    }
#endif
}